

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewFuncStart(LocationUpdater *this,BinaryLocation oldAddr)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  bool bVar4;
  pointer pvVar5;
  BinaryLocation local_50;
  BinaryLocation BStack_4c;
  FunctionLocations newLocations;
  FunctionLocations oldLocations;
  _Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
  local_30;
  const_iterator iter;
  Function *func;
  BinaryLocation oldAddr_local;
  LocationUpdater *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
             )FuncAddrMap::getStart(&this->oldFuncAddrMap,oldAddr);
  if (iter.
      super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
      ._M_cur != (__node_type *)0x0) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Function_*,_wasm::BinaryLocations::FunctionLocations,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>_>_>
         ::find(&this->newLocations->functions,(key_type *)&iter);
    oldLocations._4_8_ =
         std::
         unordered_map<wasm::Function_*,_wasm::BinaryLocations::FunctionLocations,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>_>_>
         ::end(&this->newLocations->functions);
    bVar4 = std::__detail::operator!=
                      (&local_30,
                       (_Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
                        *)&oldLocations.declarations);
    if (bVar4) {
      uVar2 = *(undefined8 *)
               ((long)iter.
                      super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
                      ._M_cur + 0x1b0);
      oldLocations.start =
           *(BinaryLocation *)
            ((long)iter.
                   super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
                   ._M_cur + 0x1b8);
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false,_false>
                             *)&local_30);
      uVar1 = (pvVar5->second).start;
      uVar3 = (pvVar5->second).declarations;
      newLocations.declarations = (BinaryLocation)uVar2;
      if (oldAddr == newLocations.declarations) {
        return uVar1;
      }
      newLocations.end = (BinaryLocation)((ulong)uVar2 >> 0x20);
      if (oldAddr == newLocations.end) {
        return uVar3;
      }
      handle_unreachable("invalid func start",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                         ,0x224);
    }
  }
  return 0;
}

Assistant:

BinaryLocation getNewFuncStart(BinaryLocation oldAddr) const {
    if (auto* func = oldFuncAddrMap.getStart(oldAddr)) {
      // The function might have been optimized away, check.
      auto iter = newLocations.functions.find(func);
      if (iter != newLocations.functions.end()) {
        auto oldLocations = func->funcLocation;
        auto newLocations = iter->second;
        if (oldAddr == oldLocations.start) {
          return newLocations.start;
        } else if (oldAddr == oldLocations.declarations) {
          return newLocations.declarations;
        } else {
          WASM_UNREACHABLE("invalid func start");
        }
      }
    }
    return 0;
  }